

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.cpp
# Opt level: O0

bool __thiscall DTreeParenthoodPropagator::propagateRemEdge(DTreeParenthoodPropagator *this,int e)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  vec<IntVar_*> *pvVar5;
  IntVar **ppIVar6;
  IntVar *this_00;
  long in_RDI;
  vec<Lit> ps;
  Clause *r;
  BoolView *in_stack_ffffffffffffff48;
  int e_00;
  GraphPropagator *in_stack_ffffffffffffff50;
  GraphPropagator *this_01;
  DReachabilityPropagator *in_stack_ffffffffffffff58;
  vec<Lit> *in_stack_ffffffffffffff60;
  int64_t in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  anon_union_8_2_743a5d44_for_Reason_0 local_48;
  int local_40;
  vec<Lit> local_30;
  Clause *local_20;
  bool local_1;
  
  bVar1 = DReachabilityPropagator::propagateRemEdge
                    (in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
  if (bVar1) {
    uVar2 = GraphPropagator::getHead
                      (in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    vec<IntVar_*>::operator[]((vec<IntVar_*> *)(in_RDI + 0x250),uVar2);
    GraphPropagator::getTail
              (in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    bVar1 = IntVar::indomain((IntVar *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                             ,in_stack_ffffffffffffff68);
    if (bVar1) {
      iVar3 = GraphPropagator::getHead
                        (in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
      iVar4 = GraphPropagator::getTail
                        (in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
      if (iVar3 == iVar4) {
        return true;
      }
      local_20 = (Clause *)0x0;
      if ((so.lazy & 1U) != 0) {
        vec<Lit>::vec(&local_30);
        vec<Lit>::push((vec<Lit> *)in_stack_ffffffffffffff50);
        GraphPropagator::getEdgeVar
                  (in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        local_40 = (int)BoolView::getValLit(in_stack_ffffffffffffff48);
        vec<Lit>::push(in_stack_ffffffffffffff60,(Lit *)in_stack_ffffffffffffff58);
        local_20 = Reason_new<vec<Lit>>((vec<Lit> *)in_stack_ffffffffffffff50);
        vec<Lit>::~vec((vec<Lit> *)in_stack_ffffffffffffff50);
      }
      pvVar5 = (vec<IntVar_*> *)(in_RDI + 0x250);
      uVar2 = GraphPropagator::getHead(in_stack_ffffffffffffff50,(int)((ulong)pvVar5 >> 0x20));
      ppIVar6 = vec<IntVar_*>::operator[](pvVar5,uVar2);
      this_01 = (GraphPropagator *)*ppIVar6;
      e_00 = (int)((ulong)pvVar5 >> 0x20);
      iVar3 = GraphPropagator::getTail(this_01,e_00);
      this_00 = (IntVar *)(long)iVar3;
      Reason::Reason((Reason *)&local_48,local_20);
      (*(this_01->super_Propagator)._vptr_Propagator[0x11])(this_01,this_00,local_48._pt,1);
      pvVar5 = (vec<IntVar_*> *)(in_RDI + 0x250);
      uVar2 = GraphPropagator::getHead(this_01,e_00);
      vec<IntVar_*>::operator[](pvVar5,uVar2);
      iVar4 = IntVar::size(this_00);
      iVar3 = (int)((ulong)*(undefined8 *)(in_RDI + 0x270) >> 0x20);
      GraphPropagator::getHead(this_01,e_00);
      Tint::operator=((Tint *)CONCAT44(iVar4,in_stack_ffffffffffffff70),iVar3);
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool DTreeParenthoodPropagator::propagateRemEdge(int e) {
	assert(getEdgeVar(e).isFixed());
	assert(getEdgeVar(e).isFalse());

	if (!DTreePropagator::propagateRemEdge(e)) {
		return false;
	}

	// If tail of e is the only possible parent of head of e
	// fail (unless head of e is the root)
	// Otherwise remove that value and that's it.
	if (parents[getHead(e)]->indomain(getTail(e))) {
		if (getHead(e) == getTail(e)) {
			return true;
		}
		Clause* r = nullptr;
		if (so.lazy) {
			vec<Lit> ps;
			ps.push();
			ps.push(getEdgeVar(e).getValLit());
			r = Reason_new(ps);
		}
		parents[getHead(e)]->remVal(getTail(e), r);
		if (DEBUG) {
			std::cout << "This guy " << getHead(e) << " cannot have " << getTail(e)
								<< " as a parent, because I removed edge" << e << '\n';
		}
		assert(parents[getHead(e)]->size() > 0);
		dom_size[getHead(e)] = parents[getHead(e)]->size();
	}

	return true;
}